

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_scanner.c
# Opt level: O1

void yyrestart(FILE *input_file)

{
  YY_BUFFER_STATE pyVar1;
  
  if ((yy_buffer_stack == (YY_BUFFER_STATE *)0x0) ||
     (yy_buffer_stack[yy_buffer_stack_top] == (YY_BUFFER_STATE)0x0)) {
    yyensure_buffer_stack();
    pyVar1 = yy_create_buffer(yyin,0x4000);
    yy_buffer_stack[yy_buffer_stack_top] = pyVar1;
  }
  if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
    pyVar1 = (YY_BUFFER_STATE)0x0;
  }
  else {
    pyVar1 = yy_buffer_stack[yy_buffer_stack_top];
  }
  yy_init_buffer(pyVar1,input_file);
  yy_n_chars = yy_buffer_stack[yy_buffer_stack_top]->yy_n_chars;
  yy_c_buf_p = yy_buffer_stack[yy_buffer_stack_top]->yy_buf_pos;
  yytext = yy_c_buf_p;
  yyin = yy_buffer_stack[yy_buffer_stack_top]->yy_input_file;
  yy_hold_char = *yy_c_buf_p;
  return;
}

Assistant:

void yyrestart  (FILE * input_file )
{
    
	if ( ! YY_CURRENT_BUFFER ){
        yyensure_buffer_stack ();
		YY_CURRENT_BUFFER_LVALUE =
            yy_create_buffer( yyin, YY_BUF_SIZE );
	}

	yy_init_buffer( YY_CURRENT_BUFFER, input_file );
	yy_load_buffer_state(  );
}